

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlDrawRenderBatch(rlRenderBatch *batch)

{
  Matrix *pMVar1;
  GLenum GVar2;
  rlDrawCall *prVar3;
  Matrix left;
  Matrix left_00;
  Matrix right;
  Matrix *pMVar4;
  _Bool _Var5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int i;
  long lVar10;
  long lVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  Matrix matMVP;
  rl_float16 result_4;
  rl_float16 result_3;
  rl_float16 result_2;
  rl_float16 result_1;
  rl_float16 result;
  Matrix matModelView;
  Matrix matProjection;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  GLfloat local_138 [16];
  Matrix local_f8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Matrix local_78;
  
  if (0 < RLGL.State.vertexCounter) {
    if (RLGL.ExtSupported.vao) {
      (*glad_glBindVertexArray)(batch->vertexBuffer[batch->currentBuffer].vaoId);
    }
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[0]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)RLGL.State.vertexCounter * 0xc,
               batch->vertexBuffer[batch->currentBuffer].vertices);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)RLGL.State.vertexCounter << 3,
               batch->vertexBuffer[batch->currentBuffer].texcoords);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)RLGL.State.vertexCounter * 0xc,
               batch->vertexBuffer[batch->currentBuffer].normals);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[3]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)RLGL.State.vertexCounter << 2,
               batch->vertexBuffer[batch->currentBuffer].colors);
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glBindVertexArray)(0);
    }
  }
  _Var5 = RLGL.State.stereoRender;
  local_78.m3 = RLGL.State.projection.m3;
  local_78.m7 = RLGL.State.projection.m7;
  local_78.m11 = RLGL.State.projection.m11;
  local_78.m15 = RLGL.State.projection.m15;
  local_78.m2 = RLGL.State.projection.m2;
  local_78.m6 = RLGL.State.projection.m6;
  local_78.m10 = RLGL.State.projection.m10;
  local_78.m14 = RLGL.State.projection.m14;
  local_78.m1 = RLGL.State.projection.m1;
  local_78.m5 = RLGL.State.projection.m5;
  local_78.m9 = RLGL.State.projection.m9;
  local_78.m13 = RLGL.State.projection.m13;
  local_78.m0 = RLGL.State.projection.m0;
  local_78.m4 = RLGL.State.projection.m4;
  local_78.m8 = RLGL.State.projection.m8;
  local_78.m12 = RLGL.State.projection.m12;
  local_f8.m3 = RLGL.State.modelview.m3;
  local_f8.m7 = RLGL.State.modelview.m7;
  local_f8.m11 = RLGL.State.modelview.m11;
  local_f8.m15 = RLGL.State.modelview.m15;
  local_f8.m2 = RLGL.State.modelview.m2;
  local_f8.m6 = RLGL.State.modelview.m6;
  local_f8.m10 = RLGL.State.modelview.m10;
  local_f8.m14 = RLGL.State.modelview.m14;
  local_f8.m1 = RLGL.State.modelview.m1;
  local_f8.m5 = RLGL.State.modelview.m5;
  local_f8.m9 = RLGL.State.modelview.m9;
  local_f8.m13 = RLGL.State.modelview.m13;
  local_f8.m0 = RLGL.State.modelview.m0;
  local_f8.m4 = RLGL.State.modelview.m4;
  local_f8.m8 = RLGL.State.modelview.m8;
  local_f8.m12 = RLGL.State.modelview.m12;
  lVar7 = 0;
  do {
    if (_Var5 != false) {
      (*glad_glViewport)(((int)lVar7 * RLGL.State.framebufferWidth) / 2,0,
                         RLGL.State.framebufferWidth / 2,RLGL.State.framebufferHeight);
      pMVar1 = RLGL.State.viewOffsetStereo + lVar7;
      local_b8._0_4_ = pMVar1->m0;
      local_b8._4_4_ = pMVar1->m4;
      pMVar4 = RLGL.State.viewOffsetStereo + lVar7;
      uStack_b0._0_4_ = pMVar4->m8;
      uStack_b0._4_4_ = pMVar4->m12;
      pMVar4 = RLGL.State.viewOffsetStereo + lVar7;
      local_a8._0_4_ = pMVar4->m1;
      local_a8._4_4_ = pMVar4->m5;
      pMVar4 = RLGL.State.viewOffsetStereo + lVar7;
      uStack_a0._0_4_ = pMVar4->m9;
      uStack_a0._4_4_ = pMVar4->m13;
      pMVar4 = RLGL.State.viewOffsetStereo + lVar7;
      local_98._0_4_ = pMVar4->m2;
      local_98._4_4_ = pMVar4->m6;
      pMVar4 = RLGL.State.viewOffsetStereo + lVar7;
      uStack_90._0_4_ = pMVar4->m10;
      uStack_90._4_4_ = pMVar4->m14;
      pMVar4 = RLGL.State.viewOffsetStereo + lVar7;
      local_88._0_4_ = pMVar4->m3;
      local_88._4_4_ = pMVar4->m7;
      pMVar4 = RLGL.State.viewOffsetStereo + lVar7;
      uStack_80._0_4_ = pMVar4->m11;
      uStack_80._4_4_ = pMVar4->m15;
      left.m8 = local_f8.m8;
      left.m12 = local_f8.m12;
      left.m0 = local_f8.m0;
      left.m4 = local_f8.m4;
      left.m1 = local_f8.m1;
      left.m5 = local_f8.m5;
      left.m9 = local_f8.m9;
      left.m13 = local_f8.m13;
      left.m2 = local_f8.m2;
      left.m6 = local_f8.m6;
      left.m10 = local_f8.m10;
      left.m14 = local_f8.m14;
      left.m3 = local_f8.m3;
      left.m7 = local_f8.m7;
      left.m11 = local_f8.m11;
      left.m15 = local_f8.m15;
      rlMatrixMultiply(left,*pMVar1);
      RLGL.State.modelview.m4 = fStack_274;
      RLGL.State.modelview.m0 = local_278;
      RLGL.State.modelview.m12 = fStack_26c;
      RLGL.State.modelview.m8 = fStack_270;
      RLGL.State.modelview.m5 = fStack_264;
      RLGL.State.modelview.m1 = local_268;
      RLGL.State.modelview.m13 = fStack_25c;
      RLGL.State.modelview.m9 = fStack_260;
      RLGL.State.modelview.m6 = fStack_254;
      RLGL.State.modelview.m2 = local_258;
      RLGL.State.modelview.m14 = fStack_24c;
      RLGL.State.modelview.m10 = fStack_250;
      RLGL.State.modelview.m7 = fStack_244;
      RLGL.State.modelview.m3 = local_248;
      RLGL.State.modelview.m15 = fStack_23c;
      RLGL.State.modelview.m11 = fStack_240;
      pMVar1 = RLGL.State.projectionStereo + lVar7;
      RLGL.State.projection.m0 = pMVar1->m0;
      RLGL.State.projection.m4 = pMVar1->m4;
      pMVar1 = RLGL.State.projectionStereo + lVar7;
      RLGL.State.projection.m8 = pMVar1->m8;
      RLGL.State.projection.m12 = pMVar1->m12;
      pMVar1 = RLGL.State.projectionStereo + lVar7;
      RLGL.State.projection.m1 = pMVar1->m1;
      RLGL.State.projection.m5 = pMVar1->m5;
      pMVar1 = RLGL.State.projectionStereo + lVar7;
      RLGL.State.projection.m9 = pMVar1->m9;
      RLGL.State.projection.m13 = pMVar1->m13;
      pMVar1 = RLGL.State.projectionStereo + lVar7;
      RLGL.State.projection.m2 = pMVar1->m2;
      RLGL.State.projection.m6 = pMVar1->m6;
      pMVar1 = RLGL.State.projectionStereo + lVar7;
      RLGL.State.projection.m10 = pMVar1->m10;
      RLGL.State.projection.m14 = pMVar1->m14;
      pMVar1 = RLGL.State.projectionStereo + lVar7;
      RLGL.State.projection.m3 = pMVar1->m3;
      RLGL.State.projection.m7 = pMVar1->m7;
      pMVar1 = RLGL.State.projectionStereo + lVar7;
      RLGL.State.projection.m11 = pMVar1->m11;
      RLGL.State.projection.m15 = pMVar1->m15;
    }
    if (0 < RLGL.State.vertexCounter) {
      (*glad_glUseProgram)(RLGL.State.currentShaderId);
      left_00.m8 = RLGL.State.modelview.m8;
      left_00.m12 = RLGL.State.modelview.m12;
      left_00.m0 = RLGL.State.modelview.m0;
      left_00.m4 = RLGL.State.modelview.m4;
      left_00.m1 = RLGL.State.modelview.m1;
      left_00.m5 = RLGL.State.modelview.m5;
      left_00.m9 = RLGL.State.modelview.m9;
      left_00.m13 = RLGL.State.modelview.m13;
      left_00.m2 = RLGL.State.modelview.m2;
      left_00.m6 = RLGL.State.modelview.m6;
      left_00.m10 = RLGL.State.modelview.m10;
      left_00.m14 = RLGL.State.modelview.m14;
      left_00.m3 = RLGL.State.modelview.m3;
      left_00.m7 = RLGL.State.modelview.m7;
      left_00.m11 = RLGL.State.modelview.m11;
      left_00.m15 = RLGL.State.modelview.m15;
      right.m8 = RLGL.State.projection.m8;
      right.m12 = RLGL.State.projection.m12;
      right.m0 = RLGL.State.projection.m0;
      right.m4 = RLGL.State.projection.m4;
      right.m1 = RLGL.State.projection.m1;
      right.m5 = RLGL.State.projection.m5;
      right.m9 = RLGL.State.projection.m9;
      right.m13 = RLGL.State.projection.m13;
      right.m2 = RLGL.State.projection.m2;
      right.m6 = RLGL.State.projection.m6;
      right.m10 = RLGL.State.projection.m10;
      right.m14 = RLGL.State.projection.m14;
      right.m3 = RLGL.State.projection.m3;
      right.m7 = RLGL.State.projection.m7;
      right.m11 = RLGL.State.projection.m11;
      right.m15 = RLGL.State.projection.m15;
      rlMatrixMultiply(left_00,right);
      (*glad_glUniformMatrix4fv)(RLGL.State.currentShaderLocs[6],1,'\0',local_138);
      if (RLGL.State.currentShaderLocs[8] != -1) {
        local_178 = CONCAT44(RLGL.State.projection.m1,RLGL.State.projection.m0);
        uStack_170 = CONCAT44(RLGL.State.projection.m3,RLGL.State.projection.m2);
        _local_168 = CONCAT44(RLGL.State.projection.m5,RLGL.State.projection.m4);
        _fStack_160 = CONCAT44(RLGL.State.projection.m7,RLGL.State.projection.m6);
        local_158 = CONCAT44(RLGL.State.projection.m9,RLGL.State.projection.m8);
        uStack_150 = CONCAT44(RLGL.State.projection.m11,RLGL.State.projection.m10);
        _local_148 = CONCAT44(RLGL.State.projection.m13,RLGL.State.projection.m12);
        _fStack_140 = CONCAT44(RLGL.State.projection.m15,RLGL.State.projection.m14);
        (*glad_glUniformMatrix4fv)(RLGL.State.currentShaderLocs[8],1,'\0',(GLfloat *)&local_178);
      }
      if (RLGL.State.currentShaderLocs[7] != -1) {
        local_1b8 = CONCAT44(RLGL.State.modelview.m1,RLGL.State.modelview.m0);
        uStack_1b0 = CONCAT44(RLGL.State.modelview.m3,RLGL.State.modelview.m2);
        _local_1a8 = CONCAT44(RLGL.State.modelview.m5,RLGL.State.modelview.m4);
        _fStack_1a0 = CONCAT44(RLGL.State.modelview.m7,RLGL.State.modelview.m6);
        local_198 = CONCAT44(RLGL.State.modelview.m9,RLGL.State.modelview.m8);
        uStack_190 = CONCAT44(RLGL.State.modelview.m11,RLGL.State.modelview.m10);
        _local_188 = CONCAT44(RLGL.State.modelview.m13,RLGL.State.modelview.m12);
        _fStack_180 = CONCAT44(RLGL.State.modelview.m15,RLGL.State.modelview.m14);
        (*glad_glUniformMatrix4fv)(RLGL.State.currentShaderLocs[7],1,'\0',(GLfloat *)&local_1b8);
      }
      if (RLGL.State.currentShaderLocs[9] != -1) {
        _local_1f8 = CONCAT44(RLGL.State.transform.m1,RLGL.State.transform.m0);
        _fStack_1f0 = CONCAT44(RLGL.State.transform.m3,RLGL.State.transform.m2);
        _local_1e8 = CONCAT44(RLGL.State.transform.m5,RLGL.State.transform.m4);
        _fStack_1e0 = CONCAT44(RLGL.State.transform.m7,RLGL.State.transform.m6);
        _local_1d8 = CONCAT44(RLGL.State.transform.m9,RLGL.State.transform.m8);
        _fStack_1d0 = CONCAT44(RLGL.State.transform.m11,RLGL.State.transform.m10);
        _local_1c8 = CONCAT44(RLGL.State.transform.m13,RLGL.State.transform.m12);
        _fStack_1c0 = CONCAT44(RLGL.State.transform.m15,RLGL.State.transform.m14);
        (*glad_glUniformMatrix4fv)(RLGL.State.currentShaderLocs[9],1,'\0',&local_1f8);
      }
      if (RLGL.State.currentShaderLocs[10] != -1) {
        fVar14 = RLGL.State.transform.m0 * RLGL.State.transform.m5 -
                 RLGL.State.transform.m4 * RLGL.State.transform.m1;
        fVar22 = RLGL.State.transform.m0 * RLGL.State.transform.m7 -
                 RLGL.State.transform.m4 * RLGL.State.transform.m3;
        fVar20 = RLGL.State.transform.m1 * RLGL.State.transform.m6 -
                 RLGL.State.transform.m5 * RLGL.State.transform.m2;
        fVar23 = RLGL.State.transform.m1 * RLGL.State.transform.m7 -
                 RLGL.State.transform.m5 * RLGL.State.transform.m3;
        fVar21 = RLGL.State.transform.m8 * RLGL.State.transform.m14 -
                 RLGL.State.transform.m12 * RLGL.State.transform.m10;
        fVar19 = RLGL.State.transform.m8 * RLGL.State.transform.m15 -
                 RLGL.State.transform.m12 * RLGL.State.transform.m11;
        fVar24 = RLGL.State.transform.m9 * RLGL.State.transform.m14 -
                 RLGL.State.transform.m13 * RLGL.State.transform.m10;
        fVar17 = RLGL.State.transform.m9 * RLGL.State.transform.m15 -
                 RLGL.State.transform.m13 * RLGL.State.transform.m11;
        fVar15 = RLGL.State.transform.m10 * RLGL.State.transform.m15 -
                 RLGL.State.transform.m14 * RLGL.State.transform.m11;
        fVar18 = RLGL.State.transform.m0 * RLGL.State.transform.m6 -
                 RLGL.State.transform.m4 * RLGL.State.transform.m2;
        fVar16 = RLGL.State.transform.m2 * RLGL.State.transform.m7 -
                 RLGL.State.transform.m6 * RLGL.State.transform.m3;
        fVar13 = RLGL.State.transform.m8 * RLGL.State.transform.m13 -
                 RLGL.State.transform.m12 * RLGL.State.transform.m9;
        fVar25 = 1.0 / (fVar16 * fVar13 +
                       ((fVar20 * fVar19 + fVar22 * fVar24 + (fVar14 * fVar15 - fVar17 * fVar18)) -
                       fVar23 * fVar21));
        _local_238 = CONCAT44(((RLGL.State.transform.m6 * fVar19 - RLGL.State.transform.m4 * fVar15)
                              - RLGL.State.transform.m7 * fVar21) * fVar25,
                              (RLGL.State.transform.m7 * fVar24 +
                              (RLGL.State.transform.m5 * fVar15 - fVar17 * RLGL.State.transform.m6))
                              * fVar25);
        _fStack_230 = CONCAT44(((RLGL.State.transform.m5 * fVar21 - RLGL.State.transform.m4 * fVar24
                                ) - RLGL.State.transform.m6 * fVar13) * fVar25,
                               (RLGL.State.transform.m7 * fVar13 +
                               (RLGL.State.transform.m4 * fVar17 - fVar19 * RLGL.State.transform.m5)
                               ) * fVar25);
        _local_228 = CONCAT44((RLGL.State.transform.m3 * fVar21 +
                              (fVar15 * RLGL.State.transform.m0 - fVar19 * RLGL.State.transform.m2))
                              * fVar25,((RLGL.State.transform.m2 * fVar17 -
                                        RLGL.State.transform.m1 * fVar15) -
                                       RLGL.State.transform.m3 * fVar24) * fVar25);
        _fStack_220 = CONCAT44((fVar13 * RLGL.State.transform.m2 +
                               (fVar24 * RLGL.State.transform.m0 - fVar21 * RLGL.State.transform.m1)
                               ) * fVar25,
                               ((RLGL.State.transform.m1 * fVar19 - fVar17 * RLGL.State.transform.m0
                                ) - RLGL.State.transform.m3 * fVar13) * fVar25);
        _local_218 = CONCAT44(((RLGL.State.transform.m14 * fVar22 -
                               RLGL.State.transform.m12 * fVar16) -
                              RLGL.State.transform.m15 * fVar18) * fVar25,
                              (RLGL.State.transform.m15 * fVar20 +
                              (RLGL.State.transform.m13 * fVar16 - fVar23 * RLGL.State.transform.m14
                              )) * fVar25);
        _fStack_210 = CONCAT44(((RLGL.State.transform.m13 * fVar18 -
                                RLGL.State.transform.m12 * fVar20) -
                               RLGL.State.transform.m14 * fVar14) * fVar25,
                               (RLGL.State.transform.m15 * fVar14 +
                               (RLGL.State.transform.m12 * fVar23 -
                               fVar22 * RLGL.State.transform.m13)) * fVar25);
        _local_208 = CONCAT44((RLGL.State.transform.m11 * fVar18 +
                              (fVar16 * RLGL.State.transform.m8 - fVar22 * RLGL.State.transform.m10)
                              ) * fVar25,
                              ((RLGL.State.transform.m10 * fVar23 - RLGL.State.transform.m9 * fVar16
                               ) - RLGL.State.transform.m11 * fVar20) * fVar25);
        _fStack_200 = CONCAT44((fVar14 * RLGL.State.transform.m10 +
                               (fVar20 * RLGL.State.transform.m8 - fVar18 * RLGL.State.transform.m9)
                               ) * fVar25,
                               ((RLGL.State.transform.m9 * fVar22 - fVar23 * RLGL.State.transform.m8
                                ) - RLGL.State.transform.m11 * fVar14) * fVar25);
        (*glad_glUniformMatrix4fv)(RLGL.State.currentShaderLocs[10],1,'\0',&local_238);
      }
      if (RLGL.ExtSupported.vao == true) {
        (*glad_glBindVertexArray)(batch->vertexBuffer[batch->currentBuffer].vaoId);
      }
      else {
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        (*glad_glVertexAttribPointer)(*RLGL.State.currentShaderLocs,3,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(*RLGL.State.currentShaderLocs);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        (*glad_glVertexAttribPointer)(RLGL.State.currentShaderLocs[1],2,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShaderLocs[1]);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        (*glad_glVertexAttribPointer)(RLGL.State.currentShaderLocs[3],3,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShaderLocs[3]);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[3]);
        (*glad_glVertexAttribPointer)(RLGL.State.currentShaderLocs[5],4,0x1401,'\x01',0,(void *)0x0)
        ;
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShaderLocs[5]);
        (*glad_glBindBuffer)(0x8893,batch->vertexBuffer[batch->currentBuffer].vboId[4]);
      }
      (*glad_glUniform4f)(RLGL.State.currentShaderLocs[0xc],1.0,1.0,1.0,1.0);
      (*glad_glUniform1i)(RLGL.State.currentShaderLocs[0xf],0);
      lVar10 = 0;
      do {
        if (RLGL.State.activeTextureId[lVar10] != 0) {
          (*glad_glActiveTexture)((int)lVar10 + 0x84c1);
          (*glad_glBindTexture)(0xde1,RLGL.State.activeTextureId[lVar10]);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      (*glad_glActiveTexture)(0x84c0);
      if (0 < batch->drawCounter) {
        lVar11 = 0;
        lVar10 = 0;
        iVar9 = 0;
        do {
          (*glad_glBindTexture)(0xde1,*(GLuint *)((long)&batch->draws->textureId + lVar11));
          prVar3 = batch->draws;
          GVar2 = *(GLenum *)((long)&prVar3->mode + lVar11);
          if ((GVar2 == 4) || (GVar2 == 1)) {
            (*glad_glDrawArrays)(GVar2,iVar9,*(GLsizei *)((long)&prVar3->vertexCount + lVar11));
          }
          else {
            iVar6 = *(int *)((long)&prVar3->vertexCount + lVar11);
            iVar8 = iVar6 + 3;
            if (-1 < iVar6) {
              iVar8 = iVar6;
            }
            iVar6 = iVar9 + 3;
            if (-1 < iVar9) {
              iVar6 = iVar9;
            }
            (*glad_glDrawElements)
                      (4,(iVar8 >> 2) * 6,0x1405,(void *)((long)((iVar6 >> 2) * 6) << 2));
          }
          iVar9 = iVar9 + *(int *)((long)&batch->draws->vertexCount + lVar11) +
                  *(int *)((long)&batch->draws->vertexAlignment + lVar11);
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x10;
        } while (lVar10 < batch->drawCounter);
      }
      if (RLGL.ExtSupported.vao == false) {
        (*glad_glBindBuffer)(0x8892,0);
        (*glad_glBindBuffer)(0x8893,0);
      }
      (*glad_glBindTexture)(0xde1,0);
    }
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glBindVertexArray)(0);
    }
    (*glad_glUseProgram)(0);
  } while ((_Var5 != false) && (bVar12 = lVar7 == 0, lVar7 = lVar7 + 1, bVar12));
  if (_Var5 != false) {
    (*glad_glViewport)(0,0,RLGL.State.framebufferWidth,RLGL.State.framebufferHeight);
  }
  RLGL.State.vertexCounter = 0;
  batch->currentDepth = -1.0;
  RLGL.State.projection.m3 = local_78.m3;
  RLGL.State.projection.m7 = local_78.m7;
  RLGL.State.projection.m11 = local_78.m11;
  RLGL.State.projection.m15 = local_78.m15;
  RLGL.State.projection.m2 = local_78.m2;
  RLGL.State.projection.m6 = local_78.m6;
  RLGL.State.projection.m10 = local_78.m10;
  RLGL.State.projection.m14 = local_78.m14;
  RLGL.State.projection.m1 = local_78.m1;
  RLGL.State.projection.m5 = local_78.m5;
  RLGL.State.projection.m9 = local_78.m9;
  RLGL.State.projection.m13 = local_78.m13;
  RLGL.State.projection.m0 = local_78.m0;
  RLGL.State.projection.m4 = local_78.m4;
  RLGL.State.projection.m8 = local_78.m8;
  RLGL.State.projection.m12 = local_78.m12;
  RLGL.State.modelview.m0 = local_f8.m0;
  RLGL.State.modelview.m4 = local_f8.m4;
  RLGL.State.modelview.m8 = local_f8.m8;
  RLGL.State.modelview.m12 = local_f8.m12;
  RLGL.State.modelview.m1 = local_f8.m1;
  RLGL.State.modelview.m5 = local_f8.m5;
  RLGL.State.modelview.m9 = local_f8.m9;
  RLGL.State.modelview.m13 = local_f8.m13;
  RLGL.State.modelview.m2 = local_f8.m2;
  RLGL.State.modelview.m6 = local_f8.m6;
  RLGL.State.modelview.m10 = local_f8.m10;
  RLGL.State.modelview.m14 = local_f8.m14;
  RLGL.State.modelview.m3 = local_f8.m3;
  RLGL.State.modelview.m7 = local_f8.m7;
  RLGL.State.modelview.m11 = local_f8.m11;
  RLGL.State.modelview.m15 = local_f8.m15;
  lVar7 = 0;
  do {
    *(undefined4 *)((long)&batch->draws->mode + lVar7) = 7;
    *(undefined4 *)((long)&batch->draws->vertexCount + lVar7) = 0;
    *(uint *)((long)&batch->draws->textureId + lVar7) = RLGL.State.defaultTextureId;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x1000);
  RLGL.State.activeTextureId[0] = 0;
  RLGL.State.activeTextureId[1] = 0;
  RLGL.State.activeTextureId[2] = 0;
  RLGL.State.activeTextureId[3] = 0;
  batch->drawCounter = 1;
  iVar6 = batch->currentBuffer + 1;
  iVar9 = 0;
  if (iVar6 < batch->bufferCount) {
    iVar9 = iVar6;
  }
  batch->currentBuffer = iVar9;
  return;
}

Assistant:

void rlDrawRenderBatch(rlRenderBatch *batch)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Update batch vertex buffers
    //------------------------------------------------------------------------------------------------------------
    // NOTE: If there is not vertex data, buffers doesn't need to be updated (vertexCount > 0)
    // TODO: If no data changed on the CPU arrays --> No need to re-update GPU arrays (use a change detector flag?)
    if (RLGL.State.vertexCounter > 0)
    {
        // Activate elements VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);

        // Vertex positions buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, RLGL.State.vertexCounter*3*sizeof(float), batch->vertexBuffer[batch->currentBuffer].vertices);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*3*4*batch->vertexBuffer[batch->currentBuffer].elementCount, batch->vertexBuffer[batch->currentBuffer].vertices, GL_DYNAMIC_DRAW);  // Update all buffer

        // Texture coordinates buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, RLGL.State.vertexCounter*2*sizeof(float), batch->vertexBuffer[batch->currentBuffer].texcoords);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*2*4*batch->vertexBuffer[batch->currentBuffer].elementCount, batch->vertexBuffer[batch->currentBuffer].texcoords, GL_DYNAMIC_DRAW); // Update all buffer

        // Normals buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, RLGL.State.vertexCounter*3*sizeof(float), batch->vertexBuffer[batch->currentBuffer].normals);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*3*4*batch->vertexBuffer[batch->currentBuffer].elementCount, batch->vertexBuffer[batch->currentBuffer].normals, GL_DYNAMIC_DRAW); // Update all buffer

        // Colors buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[3]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, RLGL.State.vertexCounter*4*sizeof(unsigned char), batch->vertexBuffer[batch->currentBuffer].colors);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*4*4*batch->vertexBuffer[batch->currentBuffer].elementCount, batch->vertexBuffer[batch->currentBuffer].colors, GL_DYNAMIC_DRAW);    // Update all buffer

        // NOTE: glMapBuffer() causes sync issue
        // If GPU is working with this buffer, glMapBuffer() will wait(stall) until GPU to finish its job
        // To avoid waiting (idle), you can call first glBufferData() with NULL pointer before glMapBuffer()
        // If you do that, the previous data in PBO will be discarded and glMapBuffer() returns a new
        // allocated pointer immediately even if GPU is still working with the previous data

        // Another option: map the buffer object into client's memory
        // Probably this code could be moved somewhere else...
        // batch->vertexBuffer[batch->currentBuffer].vertices = (float *)glMapBuffer(GL_ARRAY_BUFFER, GL_READ_WRITE);
        // if (batch->vertexBuffer[batch->currentBuffer].vertices)
        // {
            // Update vertex data
        // }
        // glUnmapBuffer(GL_ARRAY_BUFFER);

        // Unbind the current VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    }
    //------------------------------------------------------------------------------------------------------------

    // Draw batch vertex buffers (considering VR stereo if required)
    //------------------------------------------------------------------------------------------------------------
    Matrix matProjection = RLGL.State.projection;
    Matrix matModelView = RLGL.State.modelview;

    int eyeCount = 1;
    if (RLGL.State.stereoRender) eyeCount = 2;

    for (int eye = 0; eye < eyeCount; eye++)
    {
        if (eyeCount == 2)
        {
            // Setup current eye viewport (half screen width)
            rlViewport(eye*RLGL.State.framebufferWidth/2, 0, RLGL.State.framebufferWidth/2, RLGL.State.framebufferHeight);

            // Set current eye view offset to modelview matrix
            rlSetMatrixModelview(rlMatrixMultiply(matModelView, RLGL.State.viewOffsetStereo[eye]));
            // Set current eye projection matrix
            rlSetMatrixProjection(RLGL.State.projectionStereo[eye]);
        }

        // Draw buffers
        if (RLGL.State.vertexCounter > 0)
        {
            // Set current shader and upload current MVP matrix
            glUseProgram(RLGL.State.currentShaderId);

            // Create modelview-projection matrix and upload to shader
            Matrix matMVP = rlMatrixMultiply(RLGL.State.modelview, RLGL.State.projection);
            glUniformMatrix4fv(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_MVP], 1, false, rlMatrixToFloat(matMVP));

            if (RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_PROJECTION] != -1)
            {
                glUniformMatrix4fv(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_PROJECTION], 1, false, rlMatrixToFloat(RLGL.State.projection));
            }

            // WARNING: For the following setup of the view, model, and normal matrices, it is expected that
            // transformations and rendering occur between rlPushMatrix() and rlPopMatrix()

            if (RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_VIEW] != -1)
            {
                glUniformMatrix4fv(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_VIEW], 1, false, rlMatrixToFloat(RLGL.State.modelview));
            }

            if (RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_MODEL] != -1)
            {
                glUniformMatrix4fv(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_MODEL], 1, false, rlMatrixToFloat(RLGL.State.transform));
            }

            if (RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_NORMAL] != -1)
            {
                glUniformMatrix4fv(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_NORMAL], 1, false, rlMatrixToFloat(rlMatrixTranspose(rlMatrixInvert(RLGL.State.transform))));
            }

            if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);
            else
            {
                // Bind vertex attrib: position (shader-location = 0)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
                glVertexAttribPointer(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_POSITION], 3, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_POSITION]);

                // Bind vertex attrib: texcoord (shader-location = 1)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
                glVertexAttribPointer(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_TEXCOORD01], 2, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_TEXCOORD01]);

                // Bind vertex attrib: normal (shader-location = 2)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
                glVertexAttribPointer(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_NORMAL], 3, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_NORMAL]);

                // Bind vertex attrib: color (shader-location = 3)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[3]);
                glVertexAttribPointer(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_COLOR], 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_COLOR]);

                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[4]);
            }

            // Setup some default shader values
            glUniform4f(RLGL.State.currentShaderLocs[RL_SHADER_LOC_COLOR_DIFFUSE], 1.0f, 1.0f, 1.0f, 1.0f);
            glUniform1i(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MAP_DIFFUSE], 0);  // Active default sampler2D: texture0

            // Activate additional sampler textures
            // Those additional textures will be common for all draw calls of the batch
            for (int i = 0; i < RL_DEFAULT_BATCH_MAX_TEXTURE_UNITS; i++)
            {
                if (RLGL.State.activeTextureId[i] > 0)
                {
                    glActiveTexture(GL_TEXTURE0 + 1 + i);
                    glBindTexture(GL_TEXTURE_2D, RLGL.State.activeTextureId[i]);
                }
            }

            // Activate default sampler2D texture0 (one texture is always active for default batch shader)
            // NOTE: Batch system accumulates calls by texture0 changes, additional textures are enabled for all the draw calls
            glActiveTexture(GL_TEXTURE0);

            for (int i = 0, vertexOffset = 0; i < batch->drawCounter; i++)
            {
                // Bind current draw call texture, activated as GL_TEXTURE0 and Bound to sampler2D texture0 by default
                glBindTexture(GL_TEXTURE_2D, batch->draws[i].textureId);

                if ((batch->draws[i].mode == RL_LINES) || (batch->draws[i].mode == RL_TRIANGLES)) glDrawArrays(batch->draws[i].mode, vertexOffset, batch->draws[i].vertexCount);
                else
                {
    #if defined(GRAPHICS_API_OPENGL_33)
                    // We need to define the number of indices to be processed: elementCount*6
                    // NOTE: The final parameter tells the GPU the offset in bytes from the
                    // start of the index buffer to the location of the first index to process
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_INT, (GLvoid *)(vertexOffset/4*6*sizeof(GLuint)));
    #endif
    #if defined(GRAPHICS_API_OPENGL_ES2)
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_SHORT, (GLvoid *)(vertexOffset/4*6*sizeof(GLushort)));
    #endif
                }

                vertexOffset += (batch->draws[i].vertexCount + batch->draws[i].vertexAlignment);
            }

            if (!RLGL.ExtSupported.vao)
            {
                glBindBuffer(GL_ARRAY_BUFFER, 0);
                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
            }

            glBindTexture(GL_TEXTURE_2D, 0);    // Unbind textures
        }

        if (RLGL.ExtSupported.vao) glBindVertexArray(0); // Unbind VAO

        glUseProgram(0);    // Unbind shader program
    }

    // Restore viewport to default measures
    if (eyeCount == 2) rlViewport(0, 0, RLGL.State.framebufferWidth, RLGL.State.framebufferHeight);
    //------------------------------------------------------------------------------------------------------------

    // Reset batch buffers
    //------------------------------------------------------------------------------------------------------------
    // Reset vertex counter for next frame
    RLGL.State.vertexCounter = 0;

    // Reset depth for next draw
    batch->currentDepth = -1.0f;

    // Restore projection/modelview matrices
    RLGL.State.projection = matProjection;
    RLGL.State.modelview = matModelView;

    // Reset RLGL.currentBatch->draws array
    for (int i = 0; i < RL_DEFAULT_BATCH_DRAWCALLS; i++)
    {
        batch->draws[i].mode = RL_QUADS;
        batch->draws[i].vertexCount = 0;
        batch->draws[i].textureId = RLGL.State.defaultTextureId;
    }

    // Reset active texture units for next batch
    for (int i = 0; i < RL_DEFAULT_BATCH_MAX_TEXTURE_UNITS; i++) RLGL.State.activeTextureId[i] = 0;

    // Reset draws counter to one draw for the batch
    batch->drawCounter = 1;
    //------------------------------------------------------------------------------------------------------------

    // Change to next buffer in the list (in case of multi-buffering)
    batch->currentBuffer++;
    if (batch->currentBuffer >= batch->bufferCount) batch->currentBuffer = 0;
#endif
}